

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-precede.cpp
# Opt level: O0

Clause * __thiscall value_precede::ex_t(value_precede *this,int ti)

{
  int iVar1;
  Clause *pCVar2;
  IntVar **ppIVar3;
  Lit *pLVar4;
  int in_ESI;
  Clause *in_RDI;
  int ii;
  int jj;
  Clause *r;
  int in_stack_ffffffffffffffcc;
  uint local_20;
  
  pCVar2 = ::Reason_new((int)((ulong)in_RDI >> 0x20));
  for (local_20 = 0; (int)local_20 < in_ESI; local_20 = local_20 + 1) {
    ppIVar3 = vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 4),local_20);
    iVar1 = (*((*ppIVar3)->super_Var).super_Branching._vptr_Branching[0xd])
                      (*ppIVar3,(long)in_RDI[2].data[0].x,1);
    pLVar4 = Clause::operator[](in_RDI,in_stack_ffffffffffffffcc);
    pLVar4->x = iVar1;
  }
  return pCVar2;
}

Assistant:

Clause* ex_t(int ti) {
		Clause* r(Reason_new(ti + 1));
		int jj = 1;
		for (int ii = 0; ii < ti; ++ii, ++jj) {
			assert(!xs[ii]->indomain(s));
			(*r)[jj] = xs[ii]->getLit(s, LR_EQ);
		}
		return r;
	}